

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O2

int __thiscall QtPrivate::QCalendarModel::columnForFirstOfMonth(QCalendarModel *this,QDate date)

{
  long lVar1;
  DayOfWeek day;
  int iVar2;
  int iVar3;
  long in_FS_OFFSET;
  QDate date_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  date_local = date;
  day = QCalendar::dayOfWeek((QDate)&this->m_calendar);
  iVar2 = columnForDayOfWeek(this,day);
  iVar3 = QDate::day(&date_local,*(undefined8 *)&this->m_calendar);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return ((iVar2 - iVar3 % 7) + 8) % 7;
  }
  __stack_chk_fail();
}

Assistant:

int QCalendarModel::columnForFirstOfMonth(QDate date) const
{
    return (columnForDayOfWeek(static_cast<Qt::DayOfWeek>(m_calendar.dayOfWeek(date)))
            - (date.day(m_calendar) % 7) + 8) % 7;
}